

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

bool __thiscall ON_SimpleArray<int>::Permute(ON_SimpleArray<int> *this,int *index)

{
  void *__dest;
  int *buffer;
  int i;
  bool rc;
  int *index_local;
  ON_SimpleArray<int> *this_local;
  
  buffer._7_1_ = false;
  if (((this->m_a != (int *)0x0) && (0 < this->m_count)) && (index != (int *)0x0)) {
    __dest = onmalloc((long)this->m_count << 2);
    memcpy(__dest,this->m_a,(long)this->m_count << 2);
    for (buffer._0_4_ = 0; (int)buffer < this->m_count; buffer._0_4_ = (int)buffer + 1) {
      this->m_a[(int)buffer] = *(int *)((long)__dest + (long)index[(int)buffer] * 4);
    }
    onfree(__dest);
    buffer._7_1_ = true;
  }
  return buffer._7_1_;
}

Assistant:

bool ON_SimpleArray<T>::Permute( const int* index )
{
  bool rc = false;
  if ( m_a && m_count > 0 && index ) {
    int i;
    T* buffer = (T*)onmalloc(m_count*sizeof(buffer[0]));
    memcpy( (void*)(buffer), (void*)(m_a), m_count*sizeof(T) );
    for (i = 0; i < m_count; i++ )
      memcpy( (void*)(m_a+i), (void*)(buffer+index[i]), sizeof(T) ); // must use memcopy and not operator=
    onfree(buffer);
    rc = true;
  }
  return rc;
}